

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O3

void __thiscall features::Sift::process(Sift *this)

{
  byte bVar1;
  ostream *poVar2;
  pointer pOVar3;
  ulong uVar4;
  long lVar5;
  
  clock();
  clock();
  if ((this->options).verbose_output == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SIFT: Creating ",0xf);
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        (this->options).max_octave - (this->options).min_octave);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," octaves (",10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->options).min_octave);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," to ",4);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->options).max_octave);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")...",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  clock();
  create_octaves(this);
  bVar1 = (this->options).debug_output;
  if ((bool)bVar1 == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SIFT: Creating octaves took ",0x1c);
    clock();
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ms.",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    bVar1 = (this->options).debug_output;
  }
  if ((bVar1 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SIFT: Detecting local extrema...",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  clock();
  extrema_detection(this);
  bVar1 = (this->options).debug_output;
  if ((bool)bVar1 == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SIFT: Detected ",0xf);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," keypoints, took ",0x11);
    clock();
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ms.",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    bVar1 = (this->options).debug_output;
  }
  if ((bVar1 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SIFT: Localizing and filtering keypoints...",0x2b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  clock();
  keypoint_localization(this);
  if ((this->options).debug_output == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SIFT: Retained ",0xf);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," stable ",8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"keypoints, took ",0x10);
    clock();
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ms.",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  pOVar3 = (this->octaves).
           super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->octaves).
      super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>._M_impl.
      super__Vector_impl_data._M_finish != pOVar3) {
    lVar5 = 0x18;
    uVar4 = 0;
    do {
      std::
      vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
      ::clear((vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
               *)((long)&(pOVar3->img).
                         super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar5));
      uVar4 = uVar4 + 1;
      pOVar3 = (this->octaves).
               super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x60;
    } while (uVar4 < (ulong)(((long)(this->octaves).
                                    super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 5)
                            * -0x5555555555555555));
  }
  if ((this->options).verbose_output != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SIFT: Generating keypoint descriptors...",0x28);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  clock();
  descriptor_generation(this);
  if ((this->options).debug_output == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SIFT: Generated ",0x10);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," descriptors, took ",0x13);
    clock();
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ms.",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if ((this->options).verbose_output == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SIFT: Generated ",0x10);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," descriptors from ",0x12);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," keypoints,",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," took ",6);
    clock();
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ms.",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::_M_erase_at_end
            (&this->octaves,
             (this->octaves).
             super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>.
             _M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void
Sift::process (void)
{
    util::ClockTimer timer, total_timer;

    /*
     * Creates the scale space representation of the image by
     * sampling the scale space and computing the DoG images.
     * See Section 3, 3.2 and 3.3 in SIFT article.
     */
    if (this->options.verbose_output)
    {
        std::cout << "SIFT: Creating "
            << (this->options.max_octave - this->options.min_octave)
            << " octaves (" << this->options.min_octave << " to "
            << this->options.max_octave << ")..." << std::endl;
    }
    timer.reset();
    this->create_octaves();
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Creating octaves took "
            << timer.get_elapsed() << "ms." << std::endl;
    }

    /*
     * Detects local extrema in the DoG function as described in Section 3.1.
     */
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Detecting local extrema..." << std::endl;
    }
    timer.reset();
    this->extrema_detection();
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Detected " << this->keypoints.size()
            << " keypoints, took " << timer.get_elapsed() << "ms." << std::endl;
    }

    /*
     * Accurate keypoint localization and filtering.
     * According to Section 4 in SIFT article.
     */
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Localizing and filtering keypoints..." << std::endl;
    }
    timer.reset();
    this->keypoint_localization();
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Retained " << this->keypoints.size() << " stable "
            << "keypoints, took " << timer.get_elapsed() << "ms." << std::endl;
    }

    /*
     * Difference of Gaussian images are not needed anymore.
     */
    for (std::size_t i = 0; i < this->octaves.size(); ++i)
        this->octaves[i].dog.clear();

    /*
     * Generate the list of keypoint descriptors.
     * See Section 5 and 6 in the SIFT article.
     * This list can in general be larger than the amount of keypoints,
     * since for each keypoint several descriptors may be created.
     */
    if (this->options.verbose_output)
    {
        std::cout << "SIFT: Generating keypoint descriptors..." << std::endl;
    }
    timer.reset();
    this->descriptor_generation();
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Generated " << this->descriptors.size()
            << " descriptors, took " << timer.get_elapsed() << "ms."
            << std::endl;
    }
    if (this->options.verbose_output)
    {
        std::cout << "SIFT: Generated " << this->descriptors.size()
            << " descriptors from " << this->keypoints.size() << " keypoints,"
            << " took " << total_timer.get_elapsed() << "ms." << std::endl;
    }

    /* Free memory. */
    this->octaves.clear();
}